

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

void __thiscall
duckdb::MultiFileReader::FinalizeBind
          (MultiFileReader *this,MultiFileReaderData *reader_data,MultiFileOptions *file_options,
          MultiFileReaderBindData *options,
          vector<duckdb::MultiFileColumnDefinition,_true> *global_columns,
          vector<duckdb::ColumnIndex,_true> *global_column_ids,ClientContext *context,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state)

{
  column_t column_id;
  pointer pcVar1;
  bool bVar2;
  BaseFileReader *pBVar3;
  const_reference pvVar4;
  mapped_type *pmVar5;
  MultiFileConstantMap *this_00;
  const_reference pvVar6;
  idx_t iVar7;
  iterator iVar8;
  mapped_type *value_00;
  size_type __n;
  size_type __n_00;
  pointer __k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  case_insensitive_map_t<idx_t> name_map;
  Value value;
  MultiFileGlobalIndex local_148;
  MultiFileOptions *local_140;
  MultiFileReaderData *local_138;
  BaseFileReader *local_130;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_128;
  string *local_120;
  column_t local_118;
  string local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  LogicalType local_88;
  Value local_70;
  
  local_128 = global_columns;
  pBVar3 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&reader_data->reader);
  local_138 = reader_data;
  local_130 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&reader_data->reader);
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_c0._M_bucket_count = 1;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  local_140 = file_options;
  if ((file_options->union_by_name == true) &&
     ((pBVar3->columns).
      super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      .
      super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pBVar3->columns).
      super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      .
      super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    __n_00 = 0;
    do {
      pvVar4 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[](&pBVar3->columns,__n_00);
      pmVar5 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_c0,&pvVar4->name);
      *pmVar5 = __n_00;
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(pBVar3->columns).
                                     super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pBVar3->columns).
                                     super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  if ((global_column_ids->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (global_column_ids->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_120 = (string *)&local_130->file;
    this_00 = &local_138->constant_map;
    __n = 0;
    local_118 = 0x8000000000000002;
    do {
      local_148.index = __n;
      pvVar6 = vector<duckdb::ColumnIndex,_true>::operator[](global_column_ids,__n);
      column_id = pvVar6->index;
      if ((options->filename_idx).index == 0xffffffffffffffff) {
        if (column_id != 0x8000000000000002) goto LAB_01234848;
LAB_01234808:
        pBVar3 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&local_138->reader);
        iVar7 = optional_idx::GetIndex(&pBVar3->file_list_idx);
        Value::UBIGINT(&local_70,iVar7);
        ::std::vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
        ::emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value>
                  ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                    *)this_00,&local_148,&local_70);
        Value::~Value(&local_70);
      }
      else {
        iVar7 = optional_idx::GetIndex(&options->filename_idx);
        if ((column_id == 0x8000000000000000) || (column_id == iVar7)) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          pcVar1 = (local_130->file).path._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,pcVar1,pcVar1 + (local_130->file).path._M_string_length);
          Value::Value(&local_70,&local_110);
          ::std::
          vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>::
          emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value>
                    ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                      *)this_00,&local_148,&local_70);
          Value::~Value(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
        }
        else {
          if (column_id == local_118) goto LAB_01234808;
LAB_01234848:
          bVar2 = IsVirtualColumn(column_id);
          if (!bVar2) {
            if ((options->hive_partitioning_indexes).
                super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                .
                super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (options->hive_partitioning_indexes).
                super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                .
                super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              HivePartitioning::Parse
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_f0,local_120);
              for (__k = (options->hive_partitioning_indexes).
                         super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                         .
                         super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  __k != (options->hive_partitioning_indexes).
                         super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                         .
                         super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                         ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
                if (column_id == __k->index) {
                  value_00 = ::std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&local_f0,&__k->value);
                  MultiFileOptions::GetHivePartitionValue
                            (&local_70,local_140,value_00,&__k->value,context);
                  ::std::
                  vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                  ::emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value&>
                            ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                              *)this_00,&local_148,&local_70);
                  Value::~Value(&local_70);
                  ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree(&local_f0);
                  goto LAB_01234962;
                }
              }
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_f0);
            }
            if (local_140->union_by_name == true) {
              pvVar4 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                                 (local_128,column_id);
              iVar8 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&local_c0,&pvVar4->name);
              if (iVar8.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                LogicalType::LogicalType(&local_88,&pvVar4->type);
                Value::Value(&local_70,&local_88);
                ::std::
                vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                ::emplace_back<duckdb::MultiFileGlobalIndex&,duckdb::Value>
                          ((vector<duckdb::MultiFileConstantEntry,std::allocator<duckdb::MultiFileConstantEntry>>
                            *)this_00,&local_148,&local_70);
                Value::~Value(&local_70);
                LogicalType::~LogicalType(&local_88);
              }
            }
          }
        }
      }
LAB_01234962:
      __n = __n + 1;
    } while (__n < (ulong)((long)(global_column_ids->
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(global_column_ids->
                                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c0);
  return;
}

Assistant:

void MultiFileReader::FinalizeBind(MultiFileReaderData &reader_data, const MultiFileOptions &file_options,
                                   const MultiFileReaderBindData &options,
                                   const vector<MultiFileColumnDefinition> &global_columns,
                                   const vector<ColumnIndex> &global_column_ids, ClientContext &context,
                                   optional_ptr<MultiFileReaderGlobalState> global_state) {

	// create a map of name -> column index
	auto &local_columns = reader_data.reader->GetColumns();
	auto &filename = reader_data.reader->GetFileName();
	case_insensitive_map_t<idx_t> name_map;
	if (file_options.union_by_name) {
		for (idx_t col_idx = 0; col_idx < local_columns.size(); col_idx++) {
			auto &column = local_columns[col_idx];
			name_map[column.name] = col_idx;
		}
	}
	for (idx_t i = 0; i < global_column_ids.size(); i++) {
		auto global_idx = MultiFileGlobalIndex(i);
		auto &col_id = global_column_ids[i];
		auto column_id = col_id.GetPrimaryIndex();
		if ((options.filename_idx.IsValid() && column_id == options.filename_idx.GetIndex()) ||
		    column_id == COLUMN_IDENTIFIER_FILENAME) {
			// filename
			reader_data.constant_map.Add(global_idx, Value(filename));
			continue;
		}
		if (column_id == COLUMN_IDENTIFIER_FILE_INDEX) {
			// filename
			reader_data.constant_map.Add(global_idx, Value::UBIGINT(reader_data.reader->file_list_idx.GetIndex()));
			continue;
		}
		if (IsVirtualColumn(column_id)) {
			continue;
		}
		if (!options.hive_partitioning_indexes.empty()) {
			// hive partition constants
			auto partitions = HivePartitioning::Parse(filename);
			D_ASSERT(partitions.size() == options.hive_partitioning_indexes.size());
			bool found_partition = false;
			for (auto &entry : options.hive_partitioning_indexes) {
				if (column_id == entry.index) {
					Value value = file_options.GetHivePartitionValue(partitions[entry.value], entry.value, context);
					reader_data.constant_map.Add(global_idx, value);
					found_partition = true;
					break;
				}
			}
			if (found_partition) {
				continue;
			}
		}
		if (file_options.union_by_name) {
			auto &column = global_columns[column_id];
			auto &name = column.name;
			auto &type = column.type;

			auto entry = name_map.find(name);
			bool not_present_in_file = entry == name_map.end();
			if (not_present_in_file) {
				// we need to project a column with name \"global_name\" - but it does not exist in the current file
				// push a NULL value of the specified type
				reader_data.constant_map.Add(global_idx, Value(type));
				continue;
			}
		}
	}
}